

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

opj_sparse_array_int32_t * opj_dwt_init_sparse_array(opj_tcd_tilecomp_t *tilec,OPJ_UINT32 numres)

{
  int iVar1;
  int iVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  OPJ_INT32 *src;
  OPJ_BOOL OVar6;
  opj_sparse_array_int32_t *sa;
  ulong uVar7;
  ulong uVar8;
  OPJ_UINT32 OVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  OPJ_UINT32 OVar14;
  uint width;
  OPJ_UINT32 src_line_stride;
  opj_tcd_band_t *poVar15;
  
  poVar3 = tilec->resolutions;
  uVar13 = numres - 1;
  width = poVar3[uVar13].x1 - poVar3[uVar13].x0;
  uVar13 = poVar3[uVar13].y1 - poVar3[uVar13].y0;
  OVar14 = 0x40;
  if (width < 0x40) {
    OVar14 = width;
  }
  OVar9 = 0x40;
  if (uVar13 < 0x40) {
    OVar9 = uVar13;
  }
  sa = opj_sparse_array_int32_create(width,uVar13,OVar14,OVar9);
  if (sa == (opj_sparse_array_int32_t *)0x0) {
LAB_0010cc6d:
    sa = (opj_sparse_array_int32_t *)0x0;
  }
  else {
    for (uVar10 = 0; uVar10 != numres; uVar10 = uVar10 + 1) {
      poVar3 = tilec->resolutions;
      uVar13 = (int)uVar10 - 1;
      for (uVar8 = 0; uVar8 < poVar3[uVar10].numbands; uVar8 = uVar8 + 1) {
        poVar15 = poVar3[uVar10].bands + uVar8;
        for (uVar7 = 0; uVar7 < poVar3[uVar10].ph * poVar3[uVar10].pw; uVar7 = uVar7 + 1) {
          poVar4 = poVar15->precincts;
          lVar11 = 0x10;
          for (uVar12 = 0; uVar12 < poVar4[uVar7].ch * poVar4[uVar7].cw; uVar12 = uVar12 + 1) {
            poVar5 = poVar4[uVar7].cblks.enc;
            src = *(OPJ_INT32 **)((long)&poVar5->data_size + lVar11);
            if (src != (OPJ_INT32 *)0x0) {
              iVar1 = *(int *)((long)&poVar5->data + lVar11);
              OVar14 = iVar1 - poVar15->x0;
              if ((poVar15->bandno & 1) != 0) {
                OVar14 = (OVar14 + tilec->resolutions[uVar13].x1) - tilec->resolutions[uVar13].x0;
              }
              iVar2 = *(int *)((long)&poVar5->data + lVar11 + 4);
              OVar9 = iVar2 - poVar15->y0;
              if ((poVar15->bandno & 2) != 0) {
                OVar9 = (OVar9 + tilec->resolutions[uVar13].y1) - tilec->resolutions[uVar13].y0;
              }
              src_line_stride = *(int *)((long)&poVar5->layers + lVar11) - iVar1;
              OVar6 = opj_sparse_array_int32_write
                                (sa,OVar14,OVar9,OVar14 + src_line_stride,
                                 (*(int *)((long)&poVar5->layers + lVar11 + 4) - iVar2) + OVar9,src,
                                 1,src_line_stride,1);
              if (OVar6 == 0) {
                opj_sparse_array_int32_free(sa);
                goto LAB_0010cc6d;
              }
            }
            lVar11 = lVar11 + 0x48;
          }
        }
      }
    }
  }
  return sa;
}

Assistant:

static opj_sparse_array_int32_t* opj_dwt_init_sparse_array(
    opj_tcd_tilecomp_t* tilec,
    OPJ_UINT32 numres)
{
    opj_tcd_resolution_t* tr_max = &(tilec->resolutions[numres - 1]);
    OPJ_UINT32 w = (OPJ_UINT32)(tr_max->x1 - tr_max->x0);
    OPJ_UINT32 h = (OPJ_UINT32)(tr_max->y1 - tr_max->y0);
    OPJ_UINT32 resno, bandno, precno, cblkno;
    opj_sparse_array_int32_t* sa = opj_sparse_array_int32_create(
                                       w, h, opj_uint_min(w, 64), opj_uint_min(h, 64));
    if (sa == NULL) {
        return NULL;
    }

    for (resno = 0; resno < numres; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];
                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    if (cblk->decoded_data != NULL) {
                        OPJ_UINT32 x = (OPJ_UINT32)(cblk->x0 - band->x0);
                        OPJ_UINT32 y = (OPJ_UINT32)(cblk->y0 - band->y0);
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

                        if (band->bandno & 1) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            x += (OPJ_UINT32)(pres->x1 - pres->x0);
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            y += (OPJ_UINT32)(pres->y1 - pres->y0);
                        }

                        if (!opj_sparse_array_int32_write(sa, x, y,
                                                          x + cblk_w, y + cblk_h,
                                                          cblk->decoded_data,
                                                          1, cblk_w, OPJ_TRUE)) {
                            opj_sparse_array_int32_free(sa);
                            return NULL;
                        }
                    }
                }
            }
        }
    }

    return sa;
}